

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.h
# Opt level: O0

void __thiscall
eastl::
hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
::DoFreeNodes(hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
              *this,node_type **pNodeArray,size_type n)

{
  hash_node<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
  *phVar1;
  node_type *pTempNode;
  node_type *pNode;
  size_type i;
  size_type n_local;
  node_type **pNodeArray_local;
  hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
  *this_local;
  
  for (pNode._0_4_ = 0; (uint)pNode < n; pNode._0_4_ = (uint)pNode + 1) {
    pTempNode = pNodeArray[(uint)pNode];
    while (pTempNode != (node_type *)0x0) {
      phVar1 = pTempNode->mpNext;
      DoFreeNode(this,pTempNode);
      pTempNode = phVar1;
    }
    pNodeArray[(uint)pNode] = (node_type *)0x0;
  }
  return;
}

Assistant:

void hashtable<K, V, A, EK, Eq, H1, H2, H, RP, bC, bM, bU>::DoFreeNodes(node_type** pNodeArray, size_type n)
    {
        for(size_type i = 0; i < n; ++i)
        {
            node_type* pNode = pNodeArray[i];
            while(pNode)
            {
                node_type* const pTempNode = pNode;
                pNode = pNode->mpNext;
                DoFreeNode(pTempNode);
            }
            pNodeArray[i] = NULL;
        }
    }